

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBufferHelper.cpp
# Opt level: O0

void __thiscall StringBufferHelper::StringBufferHelper(StringBufferHelper *this,string *buffer)

{
  string *buffer_local;
  StringBufferHelper *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)buffer);
  this->_currentPosition = 0;
  return;
}

Assistant:

StringBufferHelper::StringBufferHelper(std::string buffer) {
    _buffer = buffer;
    _currentPosition = 0;
}